

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::Verify
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  anon_class_16_2_364abe19 fn;
  undefined1 local_30 [8];
  RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.nextAllocableBlockHead =
       (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this;
  UpdateAllocators(this);
  RecyclerVerifyListConsistencyData::RecyclerVerifyListConsistencyData
            ((RecyclerVerifyListConsistencyData *)local_30);
  GenericRecyclerVerifyListConsistencyData<SmallAllocationBlockAttributes>::
  SetupVerifyListConsistencyData<SmallAllocationBlockAttributes>
            ((GenericRecyclerVerifyListConsistencyData<SmallAllocationBlockAttributes> *)local_30,
             (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0,true,false);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(RecyclerVerifyListConsistencyData *)local_30);
  GenericRecyclerVerifyListConsistencyData<SmallAllocationBlockAttributes>::
  SetupVerifyListConsistencyData<SmallAllocationBlockAttributes>
            ((GenericRecyclerVerifyListConsistencyData<SmallAllocationBlockAttributes> *)local_30,
             (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->nextAllocableBlockHead,true,
             false);
  fn.recyclerVerifyListConsistencyData = (RecyclerVerifyListConsistencyData *)local_30;
  fn.this = this;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,fn);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::Verify()
{
    UpdateAllocators();
#if DBG
    RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) nullptr, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) nullptr, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    HeapBlockList::ForEach(fullBlockList, [DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
    {
        DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        heapBlock->Verify();
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
#if DBG
        if (TBlockType::HeapBlockAttributes::IsSmallBlock)
        {
            recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) nullptr, true, false);
        }
        else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
        {
            recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) nullptr, true, false);
        }
        else
        {
            Assert(false);
        }
#endif

        HeapBlockList::ForEach(sweepableHeapBlockList, [DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
        {
            DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
            heapBlock->Verify();
        });
    }
#endif

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) this->nextAllocableBlockHead, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) this->nextAllocableBlockHead, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    HeapBlockList::ForEach(heapBlockList, [this, DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
    {
        DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        char * bumpAllocateAddress = nullptr;
        this->ForEachAllocator([heapBlock, &bumpAllocateAddress](TBlockAllocatorType * allocator)
        {
            if (allocator->GetHeapBlock() == heapBlock && allocator->GetEndAddress() != nullptr)
            {
                Assert(bumpAllocateAddress == nullptr);
                bumpAllocateAddress = (char *)allocator->GetFreeObjectList();
            }
        });
        if (bumpAllocateAddress != nullptr)
        {
            heapBlock->VerifyBumpAllocated(bumpAllocateAddress);
        }
        else
        {
            heapBlock->Verify(false);
        }
    });
}